

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action_Request_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Action_Request_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Action_Request_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  FixedDatum *pFVar3;
  reference this_01;
  VariableDatum *pVVar4;
  KINT32 Value;
  KString local_2b0;
  KString local_290;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
  local_270;
  const_iterator citrVarEnd;
  const_iterator citrVar;
  KString local_240;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>_>
  local_220;
  const_iterator citrFixedEnd;
  const_iterator citrFixed;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Action_Request_PDU *local_18;
  Action_Request_PDU *this_local;
  
  local_18 = this;
  this_local = (Action_Request_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Action Request PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1f0,(Simulation_Management_Header *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"\tRequest ID:               ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_Data_PDU).m_ui32RequestID);
  poVar2 = std::operator<<(poVar2,"\n\tAction ID:                ");
  DATA_TYPE::ENUMS::GetEnumAsStringActionID_abi_cxx11_
            ((KString *)&citrFixed,(ENUMS *)(ulong)this->m_ui32ActionID,Value);
  poVar2 = std::operator<<(poVar2,(string *)&citrFixed);
  poVar2 = std::operator<<(poVar2,"\n\tNumber Fixed Datum:       ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(this->super_Data_PDU).super_Comment_PDU.m_ui32NumFixedDatum);
  poVar2 = std::operator<<(poVar2,"\n\tNumber Variable Datum:    ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(this->super_Data_PDU).super_Comment_PDU.m_ui32NumVariableDatum);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&citrFixed);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::operator<<(local_190,"Fixed Datum:n");
  citrFixedEnd = std::
                 vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
                 ::begin(&(this->super_Data_PDU).super_Comment_PDU.m_vFixedDatum);
  local_220._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
       ::end(&(this->super_Data_PDU).super_Comment_PDU.m_vFixedDatum);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrFixedEnd,&local_220);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>_>
              ::operator*(&citrFixedEnd);
    pFVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>::operator->(this_00);
    (*(pFVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&citrVar);
    UTILS::IndentString(&local_240,(KString *)&citrVar,1,'\t');
    std::operator<<(local_190,(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&citrVar);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>_>
    ::operator++(&citrFixedEnd);
  }
  std::operator<<(local_190,"Variable Datum:n");
  citrVarEnd = std::
               vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
               ::begin(&(this->super_Data_PDU).super_Comment_PDU.m_vVariableDatum);
  local_270._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
       ::end(&(this->super_Data_PDU).super_Comment_PDU.m_vVariableDatum);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrVarEnd,&local_270);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
              ::operator*(&citrVarEnd);
    pVVar4 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::operator->(this_01);
    (*(pVVar4->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2b0);
    UTILS::IndentString(&local_290,&local_2b0,1,'\t');
    std::operator<<(local_190,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
    ::operator++(&citrVarEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Action_Request_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Action Request PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "\tRequest ID:               "   << m_ui32RequestID
       << "\n\tAction ID:                " << GetEnumAsStringActionID( m_ui32ActionID )
       << "\n\tNumber Fixed Datum:       " << m_ui32NumFixedDatum
       << "\n\tNumber Variable Datum:    " << m_ui32NumVariableDatum
       << "\n";

    ss << "Fixed Datum:n";
    vector<FixDtmPtr>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<FixDtmPtr>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        ss << IndentString( ( *citrFixed )->GetAsString() );
    }

    ss << "Variable Datum:n";
    vector<VarDtmPtr>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<VarDtmPtr>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        ss << IndentString( ( *citrVar )->GetAsString() );
    }

    return ss.str();
}